

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::encodeField(JsonCodec *this,Field field,Reader *input,Builder output)

{
  HandlerBase *pHVar1;
  Builder BVar2;
  Impl *pIVar3;
  Type type;
  Reader local_100;
  SegmentBuilder *local_a8;
  CapTableBuilder *pCStack_a0;
  void *local_98;
  WirePointer *pWStack_90;
  undefined8 local_88;
  Reader local_78;
  HandlerBase **local_30;
  HandlerBase **handler;
  HandlerBase **local_20;
  HandlerBase **_handler376;
  Reader *input_local;
  JsonCodec *this_local;
  
  BVar2._builder = output._builder;
  _handler376 = (HandlerBase **)input;
  input_local = (Reader *)this;
  pIVar3 = kj::Own<capnp::JsonCodec::Impl,_std::nullptr_t>::operator->(&this->impl);
  kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::
  find<capnp::StructSchema::Field&>
            ((HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*> *)&handler,
             (Field *)&pIVar3->fieldHandlers);
  local_30 = kj::_::readMaybe<capnp::JsonCodec::HandlerBase*const>
                       ((Maybe<capnp::JsonCodec::HandlerBase_*const_&> *)&handler);
  local_20 = local_30;
  if (local_30 == (HandlerBase **)0x0) {
    DynamicValue::Reader::Reader(&local_100,input);
    type = StructSchema::Field::getType(&field);
    encode(this,&local_100,type,output);
    DynamicValue::Reader::~Reader(&local_100);
  }
  else {
    pHVar1 = *local_30;
    DynamicValue::Reader::Reader(&local_78,input);
    local_88._0_4_ = output._builder.dataSize;
    local_88._4_2_ = output._builder.pointerCount;
    local_88._6_2_ = output._builder._38_2_;
    output._builder.segment = BVar2._builder.segment;
    local_a8 = output._builder.segment;
    pCStack_a0 = output._builder.capTable;
    local_98 = output._builder.data;
    pWStack_90 = output._builder.pointers;
    (**pHVar1->_vptr_HandlerBase)(pHVar1,this,&local_78);
    DynamicValue::Reader::~Reader(&local_78);
  }
  return;
}

Assistant:

void JsonCodec::encodeField(StructSchema::Field field, DynamicValue::Reader input,
                            JsonValue::Builder output) const {
  KJ_IF_SOME(handler, impl->fieldHandlers.find(field)) {
    handler->encodeBase(*this, input, output);
    return;
  }

  encode(input, field.getType(), output);
}